

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pcVar2;
  LogicalType params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  undefined8 in_stack_fffffffffffffed8;
  _Alloc_hider _Var3;
  size_type in_stack_fffffffffffffef0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffef8;
  pointer pEVar4;
  pointer in_stack_ffffffffffffff10;
  undefined1 local_e8 [16];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_58 [16];
  LogicalType local_48;
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar4 = (pointer)local_e8;
  pcVar2 = (msg->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff08,pcVar2,pcVar2 + msg->_M_string_length);
  _Var3._M_p = &stack0xfffffffffffffef8;
  pcVar2 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,pcVar2,pcVar2 + params->_M_string_length);
  LogicalType::LogicalType((LogicalType *)&local_80,(LogicalType *)params_1);
  LogicalType::LogicalType(&local_48,params_2);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,*(long *)params_3,
             (long)&((params_3->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_3);
  local_c0._M_allocated_capacity = (size_type)local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,*(long *)params_4._M_dataplus._M_p,
             *(long *)(params_4._M_dataplus._M_p + 8) + *(long *)params_4._M_dataplus._M_p);
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&local_80.field_2 + 8);
  local_80.field_2._8_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)_Var1._M_pi,*(long *)params_4._M_string_length,
             *(long *)(params_4._M_string_length + 8) + *(long *)params_4._M_string_length);
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_c0;
  params_2_00._0_8_ = (string *)local_a0;
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  params_3_00._M_string_length = (size_type)__return_storage_ptr__;
  params_3_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed8;
  params_3_00.field_2._M_allocated_capacity = (size_type)_Var3._M_p;
  params_3_00.field_2._8_8_ = in_stack_fffffffffffffef0;
  params_4_00.field_2._M_allocated_capacity = (size_type)pEVar4;
  params_4_00._0_16_ = in_stack_fffffffffffffef8;
  params_4_00.field_2._8_8_ = in_stack_ffffffffffffff10;
  params_5_00.field_2._M_allocated_capacity =
       (size_type)
       values.
       super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  params_5_00._M_dataplus._M_p = (pointer)local_e8._0_8_;
  params_5_00._M_string_length = local_e8._8_8_;
  params_5_00.field_2._8_8_ =
       values.
       super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)&values,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xffffffffffffff08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffee8,&local_80,&local_48,params_2_00,params_3_00,params_4_00,
             params_5_00);
  if ((undefined1 *)local_80.field_2._8_8_ != local_58) {
    operator_delete((void *)local_80.field_2._8_8_);
  }
  if ((undefined1 *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  LogicalType::~LogicalType(&local_48);
  LogicalType::~LogicalType((LogicalType *)&local_80);
  if (_Var3._M_p != &stack0xfffffffffffffef8) {
    operator_delete(_Var3._M_p);
  }
  if (pEVar4 != (pointer)local_e8) {
    operator_delete(pEVar4);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}